

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O2

void __thiscall
cmLocalGenerator::AddISPCDependencies(cmLocalGenerator *this,cmGeneratorTarget *target)

{
  cmSourceFile *this_00;
  pointer ppcVar1;
  bool bVar2;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var3;
  cmValue cVar4;
  string *psVar5;
  cmGeneratorTarget *target_00;
  pointer config;
  pointer ppcVar6;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> sources;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ispcArchSuffixes;
  string rootObjectDir;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  configsList;
  string headerPath;
  string ispcSource;
  string headerDir;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  objs;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  enabledLanguages;
  _Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> local_168;
  string *local_148;
  ulong local_140;
  string *local_138;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_130;
  string local_118;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_f8;
  string local_e0;
  string local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_80;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_68;
  string local_50;
  
  cmState::GetEnabledLanguages_abi_cxx11_
            (&local_68,
             (this->GlobalGenerator->CMakeInstance->State)._M_t.
             super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
             super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
             super__Head_base<0UL,_cmState_*,_false>._M_head_impl);
  _Var3 = std::
          __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<char_const[5]>>
                    (local_68.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     local_68.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,"ISPC");
  if (_Var3._M_current !=
      local_68.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_118,"ISPC_HEADER_SUFFIX",(allocator<char> *)&local_a0);
    cVar4 = cmGeneratorTarget::GetProperty(target,&local_118);
    std::__cxx11::string::~string((string *)&local_118);
    if (cVar4.Value == (string *)0x0) {
      __assert_fail("ispcHeaderSuffixProp",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmLocalGenerator.cxx"
                    ,0xa51,"void cmLocalGenerator::AddISPCDependencies(cmGeneratorTarget *)");
    }
    detail::ComputeISPCObjectSuffixes_abi_cxx11_(&local_130,(detail *)target,target_00);
    local_140 = (long)local_130.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)local_130.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
    local_138 = cVar4.Value;
    cmMakefile::GetGeneratorConfigs_abi_cxx11_(&local_f8,this->Makefile,IncludeEmptyConfig);
    local_148 = local_f8.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    config = local_f8.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    while( true ) {
      if (config == local_148) break;
      cmGeneratorTarget::GetObjectDirectory(&local_118,target,config);
      std::__cxx11::string::string((string *)&local_a0,(string *)&local_118);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_50,"ISPC_HEADER_DIRECTORY",(allocator<char> *)&local_c0);
      cVar4 = cmGeneratorTarget::GetProperty(target,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      if (cVar4.Value != (string *)0x0) {
        psVar5 = GetBinaryDirectory_abi_cxx11_(this);
        local_e0._M_dataplus._M_p._0_1_ = 0x2f;
        cmStrCat<std::__cxx11::string_const&,char,std::__cxx11::string_const&>
                  (&local_c0,psVar5,(char *)&local_e0,cVar4.Value);
        cmsys::SystemTools::CollapseFullPath(&local_50,&local_c0);
        std::__cxx11::string::operator=((string *)&local_a0,(string *)&local_50);
        std::__cxx11::string::~string((string *)&local_50);
        std::__cxx11::string::~string((string *)&local_c0);
      }
      local_168._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_168._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_168._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      cmGeneratorTarget::GetSourceFiles
                (target,(vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)&local_168,config
                );
      ppcVar1 = local_168._M_impl.super__Vector_impl_data._M_finish;
      for (ppcVar6 = local_168._M_impl.super__Vector_impl_data._M_start; ppcVar6 != ppcVar1;
          ppcVar6 = ppcVar6 + 1) {
        this_00 = *ppcVar6;
        cmSourceFile::GetLanguage_abi_cxx11_(&local_50,this_00);
        bVar2 = std::operator==(&local_50,"ISPC");
        if (bVar2) {
          psVar5 = cmGeneratorTarget::GetObjectName_abi_cxx11_(target,this_00);
          cmsys::SystemTools::GetFilenameWithoutLastExtension(&local_c0,psVar5);
          cmsys::SystemTools::GetFilenameWithoutLastExtension(&local_e0,&local_c0);
          std::__cxx11::string::operator=((string *)&local_c0,(string *)&local_e0);
          std::__cxx11::string::~string((string *)&local_e0);
          local_80.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start._0_1_ = 0x2f;
          cmStrCat<std::__cxx11::string&,char,std::__cxx11::string&,std::__cxx11::string_const&>
                    (&local_e0,&local_a0,(char *)&local_80,&local_c0,local_138);
          cmGeneratorTarget::AddISPCGeneratedHeader(target,&local_e0,config);
          if (0x20 < local_140) {
            detail::ComputeISPCExtraObjects(&local_80,psVar5,&local_118,&local_130);
            cmGeneratorTarget::AddISPCGeneratedObject(target,&local_80,config);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&local_80);
          }
          std::__cxx11::string::~string((string *)&local_e0);
          std::__cxx11::string::~string((string *)&local_c0);
        }
        std::__cxx11::string::~string((string *)&local_50);
      }
      std::_Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::~_Vector_base(&local_168);
      std::__cxx11::string::~string((string *)&local_a0);
      std::__cxx11::string::~string((string *)&local_118);
      config = config + 1;
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_f8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_130);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_68);
  return;
}

Assistant:

void cmLocalGenerator::AddISPCDependencies(cmGeneratorTarget* target)
{
  std::vector<std::string> enabledLanguages =
    this->GetState()->GetEnabledLanguages();
  if (std::find(enabledLanguages.begin(), enabledLanguages.end(), "ISPC") ==
      enabledLanguages.end()) {
    return;
  }

  cmValue ispcHeaderSuffixProp = target->GetProperty("ISPC_HEADER_SUFFIX");
  assert(ispcHeaderSuffixProp);

  std::vector<std::string> ispcArchSuffixes =
    detail::ComputeISPCObjectSuffixes(target);
  const bool extra_objects = (ispcArchSuffixes.size() > 1);

  std::vector<std::string> configsList =
    this->Makefile->GetGeneratorConfigs(cmMakefile::IncludeEmptyConfig);
  for (std::string const& config : configsList) {

    std::string rootObjectDir = target->GetObjectDirectory(config);
    std::string headerDir = rootObjectDir;
    if (cmValue prop = target->GetProperty("ISPC_HEADER_DIRECTORY")) {
      headerDir = cmSystemTools::CollapseFullPath(
        cmStrCat(this->GetBinaryDirectory(), '/', *prop));
    }

    std::vector<cmSourceFile*> sources;
    target->GetSourceFiles(sources, config);

    // build up the list of ispc headers and extra objects that this target is
    // generating
    for (cmSourceFile const* sf : sources) {
      // Generate this object file's rule file.
      const std::string& lang = sf->GetLanguage();
      if (lang == "ISPC") {
        std::string const& objectName = target->GetObjectName(sf);

        // Drop both ".obj" and the source file extension
        std::string ispcSource =
          cmSystemTools::GetFilenameWithoutLastExtension(objectName);
        ispcSource =
          cmSystemTools::GetFilenameWithoutLastExtension(ispcSource);

        auto headerPath =
          cmStrCat(headerDir, '/', ispcSource, *ispcHeaderSuffixProp);
        target->AddISPCGeneratedHeader(headerPath, config);
        if (extra_objects) {
          std::vector<std::string> objs = detail::ComputeISPCExtraObjects(
            objectName, rootObjectDir, ispcArchSuffixes);
          target->AddISPCGeneratedObject(std::move(objs), config);
        }
      }
    }
  }
}